

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

TimerHolder __thiscall
Liby::EventLoop::runAfter(EventLoop *this,Timestamp *timestamp,BasicHandler *handler)

{
  Timestamp *timeout;
  long lVar1;
  int iVar2;
  TimerHolder TVar3;
  Timestamp ret;
  _Any_data local_48;
  timeval local_38;
  
  timeout = (Timestamp *)timestamp[1].tv_.tv_sec;
  local_38.tv_sec = 0;
  local_38.tv_usec = 0;
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  local_48._M_unused._0_8_ =
       (undefined8)(local_38.tv_sec + *(long *)&(handler->super__Function_base)._M_functor);
  local_48._8_8_ =
       local_38.tv_usec + *(long *)((long)&(handler->super__Function_base)._M_functor + 8);
  iVar2 = (int)((ulong)local_48._8_8_ >> 0x20);
  if (1000000 < (uint)local_48._8_8_) {
    lVar1 = ((long)local_48._8_8_ / 1000000 + ((long)iVar2 >> 0x1f)) - ((long)iVar2 >> 0x1f);
    local_48._M_unused._0_8_ = (undefined8)((long)local_48._M_unused._0_8_ + lVar1);
    local_48._8_8_ = local_48._8_8_ + lVar1 * -1000000;
  }
  TVar3 = TimerQueue::insert((TimerQueue *)this,timeout,(BasicHandler *)&local_48);
  TVar3.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (TimerHolder)TVar3.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TimerHolder EventLoop::runAfter(const Timestamp &timestamp,
                                const BasicHandler &handler) {
    return tqueue_->insert(timestamp + Timestamp::now(), handler);
}